

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bindexplib.h
# Opt level: O2

void __thiscall bindexplib::bindexplib(bindexplib *this)

{
  _Rb_tree_header *p_Var1;
  
  p_Var1 = &(this->Symbols)._M_t._M_impl.super__Rb_tree_header;
  (this->Symbols)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->Symbols)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->Symbols)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->Symbols)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->Symbols)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var1 = &(this->DataSymbols)._M_t._M_impl.super__Rb_tree_header;
  (this->DataSymbols)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->DataSymbols)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->DataSymbols)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->DataSymbols)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->DataSymbols)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->NmPath)._M_dataplus._M_p = (pointer)&(this->NmPath).field_2;
  (this->NmPath)._M_string_length = 0;
  (this->NmPath).field_2._M_local_buf[0] = '\0';
  std::__cxx11::string::assign((char *)&this->NmPath);
  return;
}

Assistant:

bindexplib() { NmPath = "nm"; }